

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::AddCompileOption(cmMakefile *this,char *option)

{
  allocator local_39;
  string local_38;
  char *local_18;
  char *option_local;
  cmMakefile *this_local;
  
  local_18 = option;
  option_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"COMPILE_OPTIONS",&local_39);
  AppendProperty(this,&local_38,local_18,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void cmMakefile::AddCompileOption(const char* option)
{
  this->AppendProperty("COMPILE_OPTIONS", option);
}